

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void printf_block_definition(BlockDefinition *block_definition,uint alignment)

{
  ForBlockDefinition *for_block_definition;
  ElseBlockDefinition *else_block_definition;
  IfBlockDefinition *if_block_definition;
  size_t i;
  IfElseGroupBlockDefinition *if_else_group_block_definition;
  uint alignment_local;
  BlockDefinition *block_definition_local;
  
  switch(block_definition->block_definition_type) {
  case BlockDefinitionTypeIfBlock:
    printf_alignment(alignment);
    printf("IF");
    if (*(long *)(block_definition + 4) != 0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      printf(";");
    }
    printf_expression(*(Expression **)(block_definition + 6),alignment);
    printf("\n");
    printf_block(*(Block **)(block_definition + 2),alignment);
    break;
  case BlockDefinitionTypeElseBlock:
    printf_block(*(Block **)(block_definition + 2),alignment);
    break;
  case BlockDefinitionTypeIfElseGroupBlock:
    for (if_block_definition = (IfBlockDefinition *)0x0;
        if_block_definition < *(IfBlockDefinition **)(block_definition + 2);
        if_block_definition =
             (IfBlockDefinition *)
             ((long)&(if_block_definition->block_definition).block_definition_type + 1)) {
      printf_block_definition
                (*(BlockDefinition **)
                  (*(long *)(block_definition + 4) + (long)if_block_definition * 8),alignment);
    }
    if (*(long *)(block_definition + 6) != 0) {
      printf_block_definition(*(BlockDefinition **)(block_definition + 6),alignment);
    }
    break;
  case BlockDefinitionTypeForBlock:
    printf_alignment(alignment);
    printf("FOR");
    if (*(long *)(block_definition + 4) != 0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      printf(";");
    }
    printf_expression(*(Expression **)(block_definition + 6),alignment);
    if (*(long *)(block_definition + 8) != 0) {
      printf(";");
      printf_expression(*(Expression **)(block_definition + 8),alignment);
    }
    printf("\n");
    printf_block(*(Block **)(block_definition + 2),alignment);
  }
  return;
}

Assistant:

void printf_block_definition(BlockDefinition *block_definition, unsigned int alignment) {
  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *)block_definition;

      for (size_t i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->if_block_definitions[i], alignment);
      }

      if (if_else_group_block_definition->else_block_definition) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->else_block_definition, alignment);
      }

      break;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("IF");

      if (if_block_definition->pre_expression) {
        printf_expression(if_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(if_block_definition->condition, alignment);
      printf("\n");
      printf_block(if_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;
      printf_block(else_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("FOR");

      if (for_block_definition->pre_expression) {
        printf_expression(for_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(for_block_definition->condition, alignment);

      if (for_block_definition->post_expression) {
        printf(";");
        printf_expression(for_block_definition->post_expression, alignment);
      }
      printf("\n");
      printf_block(for_block_definition->block, alignment);

      break;
    }
  }
}